

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserTest.cpp
# Opt level: O2

void __thiscall
ODDLParser::OpenDDLParserTest_parseFloatHexaLiteralTest_Test::TestBody
          (OpenDDLParserTest_parseFloatHexaLiteralTest_Test *this)

{
  size_t sVar1;
  char *pcVar2;
  char *in_R9;
  float actual;
  AssertHelper AStack_68;
  AssertHelper local_60;
  AssertionResult gtest_ar_;
  Value *data;
  AssertionResult gtest_ar;
  char token1 [11];
  
  builtin_strncpy(token1,"0x3F800000",0xb);
  sVar1 = strlen(token1);
  data = (Value *)0x0;
  pcVar2 = OpenDDLParser::parseHexaLiteral(token1,token1 + sVar1,&data);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = pcVar2 != (char *)0x0;
  if (pcVar2 == (char *)0x0) {
    testing::Message::Message((Message *)&AStack_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"nullptr == in","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x22a,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&AStack_68);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&AStack_68);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    actual = Value::getFloat(data);
    testing::internal::CmpHelperFloatingPointEQ<float>
              ((internal *)&gtest_ar,"1.0f","value",1.0,actual);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&AStack_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
                 ,0x22c,pcVar2);
      testing::internal::AssertHelper::operator=(&AStack_68,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper(&AStack_68);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    OpenDDLParserTest::registerValueForDeletion(&this->super_OpenDDLParserTest,data);
  }
  return;
}

Assistant:

TEST_F(OpenDDLParserTest, parseFloatHexaLiteralTest) {
    size_t len(0);
    char token1[] = "0x3F800000", *end(findEnd(token1, len));
    Value *data(nullptr);
    char *in = OpenDDLParser::parseHexaLiteral(token1, end, &data);
    ASSERT_FALSE(nullptr == in);
    const float value(data->getFloat());
    EXPECT_FLOAT_EQ(1.0f, value);
    registerValueForDeletion(data);
}